

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

Result Clasp::ClauseCreator::integrate
                 (Solver *s,SharedLiterals *clause,uint32 modeFlags,ConstraintType t)

{
  ExtendedStats *this;
  bool bVar1;
  Status st;
  uint32 uVar2;
  ClauseHead *this_00;
  uint uVar3;
  uint32 uVar4;
  uint size;
  long *plVar5;
  Result RVar6;
  ClauseRep x;
  Literal temp [5];
  SharedLiterals *local_78;
  ClauseRep local_70;
  SharedLiterals *local_60;
  undefined8 local_58;
  ulong uStack_50;
  undefined4 local_48;
  Antecedent local_38;
  
  uStack_50 = 0;
  local_48 = 0;
  local_78 = (SharedLiterals *)0x0;
  if ((modeFlags & 0x20) == 0) {
    local_78 = clause;
  }
  local_58 = 0x200000002;
  local_60 = clause + 1;
  local_38.data_._0_4_ = t << 0x1c;
  local_70 = prepare(s,(Literal *)local_60,clause->size_type_ >> 2,(ConstraintInfo *)&local_38,0,
                     (Literal *)&local_58,5);
  uVar3 = 1;
  if ((modeFlags & 2) == 0) {
    bVar1 = Solver::allowImplicit(s,&local_70);
    uVar3 = (uint)bVar1 * 2 + 1;
  }
  st = status(s,&local_70);
  bVar1 = ignoreClause(s,&local_70,st,modeFlags);
  if (bVar1) {
    this_00 = (ClauseHead *)0x0;
  }
  else {
    if ((modeFlags >> 9 & 1) == 0) {
      plVar5 = (long *)((s->heuristic_).ptr_ & 0xfffffffffffffffe);
      (**(code **)(*plVar5 + 0x48))(plVar5,s,local_60,clause->size_type_ >> 2,t);
    }
    if (((local_70._4_4_ & 0x7ffffffe) < 6) ||
       (((uint)s->shared_->share_ >> 0x14 & 2 - (t == Static)) == 0)) {
      size = local_70._4_4_ & 0x7fffffff;
      if (uVar3 < size) {
        if (size < 6) {
          this_00 = Clause::newClause(s,&local_70);
        }
        else {
          this_00 = newUnshared(s,clause,(Literal *)&local_58,&local_70.info);
        }
      }
      else {
        this = (s->stats).extra;
        if (this != (ExtendedStats *)0x0) {
          ExtendedStats::addLearnt
                    (this,size,(uint)local_70.info.super_ConstraintScore.rep >> 0x1c & Other);
        }
        modeFlags = modeFlags | 1;
        this_00 = (ClauseHead *)0x0;
      }
    }
    else {
      this_00 = mt::SharedLitsClause::newClause
                          (s,clause,&local_70.info,(Literal *)&local_58,
                           local_78 == (SharedLiterals *)0x0);
      local_78 = (SharedLiterals *)0x0;
    }
    if ((modeFlags & 1) == 0) {
      Solver::addLearnt(s,&this_00->super_Constraint,local_70._4_4_ & 0x7fffffff,
                        (uint)local_70.info.super_ConstraintScore.rep >> 0x1c & Other);
    }
    if ((st & status_asserting) != status_open) {
      local_38.data_ = (uint64)this_00;
      if (this_00 == (ClauseHead *)0x0) {
        local_38.data_ =
             (uint64)(((ulong)(local_58._4_4_ >> 1 ^ 1) << 0x21) +
                      (uStack_50 >> 1 & 0x7fffffff ^ 1) * 4 + 1);
      }
      bVar1 = Solver::force(s,local_58._0_4_,
                            *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                                     (ulong)(local_58._4_4_ & 0xfffffffc)) >> 4,&local_38,0xffffffff
                           );
      if ((modeFlags & 0x40) != 0 && this_00 != (ClauseHead *)0x0) {
        uVar2 = Solver::countLevels(s,(Literal *)local_60,
                                    (Literal *)
                                    ((long)&(local_60->refCount_).super___atomic_base<int>._M_i +
                                    (ulong)(clause->size_type_ & 0xfffffffc)),0x7f);
        uVar4 = 0x7f;
        if (uVar2 < 0x7f) {
          uVar4 = uVar2;
        }
        ClauseHead::resetScore
                  (this_00,(ScoreType)
                           (uVar4 << 0x14 | (uint)local_70.info.super_ConstraintScore.rep & 0xfffff)
                  );
      }
      st = (uint)bVar1 * 2 + status_unsat;
    }
  }
  if (local_78 != (SharedLiterals *)0x0) {
    LOCK();
    (local_78->refCount_).super___atomic_base<int>._M_i =
         (local_78->refCount_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->refCount_).super___atomic_base<int>._M_i == 0) {
      operator_delete(local_78);
    }
  }
  RVar6.status = st;
  RVar6.local = this_00;
  RVar6._12_4_ = 0;
  return RVar6;
}

Assistant:

ClauseCreator::Result ClauseCreator::integrate(Solver& s, SharedLiterals* clause, uint32 modeFlags, ConstraintType t) {
	assert(!s.hasConflict() && "ClauseCreator::integrate() - precondition violated!");
	Detail::Sink shared( (modeFlags & clause_no_release) == 0 ? clause : 0);
	// determine state of clause
	Literal temp[Clause::MAX_SHORT_LEN]; temp[0] = temp[1] = lit_false();
	ClauseRep x    = prepare(s, clause->begin(), clause->size(), ConstraintInfo(t), 0, temp, Clause::MAX_SHORT_LEN);
	uint32 impSize = (modeFlags & clause_explicit) != 0 || !s.allowImplicit(x) ? 1 : 3;
	Status xs      = status(s, x);
	if (ignoreClause(s, x, xs, modeFlags)) {
		return Result(0, xs);
	}
	Result result(0, xs);
	if ((modeFlags & clause_no_heuristic) == 0) { s.heuristic()->newConstraint(s, clause->begin(), clause->size(), t); }
	if (x.size > Clause::MAX_SHORT_LEN && s.sharedContext()->physicalShare(t)) {
		result.local  = Clause::newShared(s, clause, x.info, temp, shared.clause == 0);
		shared.clause = 0;
	}
	else if (x.size > impSize) {
		result.local  = x.size <= Clause::MAX_SHORT_LEN ? Clause::newClause(s, x) : newUnshared(s, clause, temp, x.info);
	}
	else {
		// unary clause or implicitly shared via binary/ternary implication graph;
		// only check for implication/conflict but do not create
		// a local representation for the clause
		s.stats.addLearnt(x.size, x.info.type());
		modeFlags |= clause_no_add;
	}
	if ((modeFlags & clause_no_add) == 0) { s.addLearnt(result.local, x.size, x.info.type()); }
	if ((xs & (status_unit|status_unsat)) != 0) {
		Antecedent ante = result.local ? Antecedent(result.local) : Antecedent(~temp[1], ~temp[2]);
		uint32 impLevel = s.level(temp[1].var());
		result.status   = s.force(temp[0], impLevel, ante) ? status_unit : status_unsat;
		if (result.local && (modeFlags & clause_int_lbd) != 0) {
			uint32 lbd = s.countLevels(clause->begin(), clause->end());
			result.local->resetScore(makeScore(x.info.activity(), lbd));
		}
	}
	return result;
}